

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::
AddTestPattern(ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
               *this,char *param_1,char *test_base_name,
              TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>
              *meta_factory,CodeLocation *code_location)

{
  CodeLocation *a_test_meta_factory;
  TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>
  *a_test_base_name;
  TestInfo *this_00;
  CodeLocation local_60;
  TestInfo *local_38;
  CodeLocation *local_30;
  CodeLocation *code_location_local;
  TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>
  *meta_factory_local;
  char *test_base_name_local;
  char *param_1_local;
  ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>
  *this_local;
  
  local_30 = code_location;
  code_location_local = (CodeLocation *)meta_factory;
  meta_factory_local =
       (TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam> *)
       test_base_name;
  test_base_name_local = param_1;
  param_1_local = (char *)this;
  this_00 = (TestInfo *)operator_new(0x50);
  a_test_base_name = meta_factory_local;
  a_test_meta_factory = code_location_local;
  CodeLocation::CodeLocation(&local_60,code_location);
  TestInfo::TestInfo(this_00,(char *)a_test_base_name,
                     (TestMetaFactoryBase<google::protobuf::internal::(anonymous_namespace)::TestParam>
                      *)a_test_meta_factory,&local_60);
  local_38 = this_00;
  std::
  vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>>>
  ::
  emplace_back<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo*>
            ((vector<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>,std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest>::TestInfo>>>
              *)&this->tests_,&local_38);
  CodeLocation::~CodeLocation(&local_60);
  return;
}

Assistant:

void AddTestPattern(const char*,
                      const char* test_base_name,
                      TestMetaFactoryBase<ParamType>* meta_factory,
                      CodeLocation code_location) {
    tests_.emplace_back(
        new TestInfo(test_base_name, meta_factory, std::move(code_location)));
  }